

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O3

void * embree::alignedMalloc(size_t size,size_t align)

{
  int iVar1;
  void *in_RAX;
  size_t __alignment;
  undefined8 *puVar2;
  void *local_8;
  
  if (size == 0) {
    local_8 = (void *)0x0;
  }
  else {
    if (align == 1) {
      local_8 = malloc(size);
    }
    else {
      __alignment = 8;
      if (8 < align) {
        __alignment = align;
      }
      if ((align & align - 1) != 0) {
        __alignment = align;
      }
      local_8 = in_RAX;
      iVar1 = posix_memalign(&local_8,__alignment,size);
      if (iVar1 != 0) goto LAB_001df457;
    }
    if (local_8 == (void *)0x0) {
LAB_001df457:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = rtcSetGeometryTimeRange;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return local_8;
}

Assistant:

void* alignedMalloc(size_t size, size_t align)
  {
    if (size == 0)
      return nullptr;

    assert((align & (align-1)) == 0);
    void* ptr = _mm_malloc(size,align);
    if (size != 0 && ptr == nullptr)
      throw std::bad_alloc();
    return ptr;
  }